

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
put_length(basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          size_t length)

{
  ser_error *this_00;
  uint8_t (*__range2) [8];
  uint uVar1;
  long lVar2;
  error_code ec;
  uint8_t buf [8];
  ulong local_28;
  error_code local_20;
  
  if (length < 0x100) {
    binary_stream_sink::push_back(&this->sink_,'U');
    binary_stream_sink::push_back(&this->sink_,(uint8_t)length);
    return;
  }
  if (length < 0x8000) {
    binary_stream_sink::push_back(&this->sink_,'I');
    local_28 = CONCAT62(local_28._2_6_,(ushort)length << 8 | (ushort)length >> 8);
    lVar2 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_28 + lVar2));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 2);
  }
  else if (length < 0x80000000) {
    binary_stream_sink::push_back(&this->sink_,'l');
    uVar1 = (uint)length;
    local_28 = CONCAT44(local_28._4_4_,
                        uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18);
    lVar2 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_28 + lVar2));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    if ((long)length < 0) {
      this_00 = (ser_error *)__cxa_allocate_exception(0x58);
      std::error_code::error_code<jsoncons::ubjson::ubjson_errc,void>(&local_20,too_many_items);
      ec._4_4_ = 0;
      ec._M_value = local_20._M_value;
      ec._M_cat = local_20._M_cat;
      ser_error::ser_error(this_00,ec);
      __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
    }
    binary_stream_sink::push_back(&this->sink_,'L');
    local_28 = length >> 0x38 | (length & 0xff000000000000) >> 0x28 |
               (length & 0xff0000000000) >> 0x18 | (length & 0xff00000000) >> 8 |
               (length & 0xff000000) << 8 | (length & 0xff0000) << 0x18 | (length & 0xff00) << 0x28
               | length << 0x38;
    lVar2 = 0;
    do {
      binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_28 + lVar2));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  return;
}

Assistant:

void put_length(std::size_t length)
    {
        if (length <= (std::numeric_limits<uint8_t>::max)())
        {
            sink_.push_back(ubjson_type::uint8_type);
            binary::native_to_big(static_cast<uint8_t>(length), std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int16_t>::max)())
        {
            sink_.push_back(ubjson_type::int16_type);
            binary::native_to_big(static_cast<uint16_t>(length), std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int32_t>::max)())
        {
            sink_.push_back(ubjson_type::int32_type);
            binary::native_to_big(static_cast<uint32_t>(length),std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int64_t>::max)())
        {
            sink_.push_back(ubjson_type::int64_type);
            binary::native_to_big(static_cast<uint64_t>(length),std::back_inserter(sink_));
        }
        else
        {
            JSONCONS_THROW(ser_error(ubjson_errc::too_many_items));
        }
    }